

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_resampler.cpp
# Opt level: O0

long __thiscall
cubeb_resampler_speex<float,_cubeb_resampler_speex_one_way<float>,_delay_line<float>_>::
fill_internal_input(cubeb_resampler_speex<float,_cubeb_resampler_speex_one_way<float>,_delay_line<float>_>
                    *this,float *input_buffer,long *input_frames_count,float *output_buffer,
                   long param_5)

{
  uint uVar1;
  size_t sVar2;
  float *pfVar3;
  long lVar4;
  size_t *in_RDX;
  size_t in_RSI;
  cubeb_resampler_speex_one_way<float> *in_RDI;
  long got;
  size_t frames_resampled;
  uint32_t resampled_frame_count;
  float *resampled_input;
  size_t in_stack_ffffffffffffffa0;
  cubeb_resampler_speex_one_way<float> *in_stack_ffffffffffffffb0;
  undefined8 in_stack_ffffffffffffffb8;
  uint32_t input_frames;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  cubeb_resampler_speex_one_way<float> *this_00;
  size_t local_8;
  
  input_frames = (uint32_t)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  this_00 = in_RDI;
  std::
  unique_ptr<cubeb_resampler_speex_one_way<float>,_std::default_delete<cubeb_resampler_speex_one_way<float>_>_>
  ::operator->((unique_ptr<cubeb_resampler_speex_one_way<float>,_std::default_delete<cubeb_resampler_speex_one_way<float>_>_>
                *)0x127979);
  sVar2 = cubeb_resampler_speex_one_way<float>::output_for_input
                    ((cubeb_resampler_speex_one_way<float> *)
                     CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),input_frames);
  uVar1 = (uint)sVar2;
  std::
  unique_ptr<cubeb_resampler_speex_one_way<float>,_std::default_delete<cubeb_resampler_speex_one_way<float>_>_>
  ::operator->((unique_ptr<cubeb_resampler_speex_one_way<float>,_std::default_delete<cubeb_resampler_speex_one_way<float>_>_>
                *)0x12799d);
  cubeb_resampler_speex_one_way<float>::input
            (in_stack_ffffffffffffffb0,(float *)in_RDI,in_stack_ffffffffffffffa0);
  if (uVar1 == 0) {
    local_8 = *in_RDX;
  }
  else {
    sVar2 = 0;
    std::
    unique_ptr<cubeb_resampler_speex_one_way<float>,_std::default_delete<cubeb_resampler_speex_one_way<float>_>_>
    ::operator->((unique_ptr<cubeb_resampler_speex_one_way<float>,_std::default_delete<cubeb_resampler_speex_one_way<float>_>_>
                  *)0x1279e2);
    pfVar3 = cubeb_resampler_speex_one_way<float>::output(this_00,in_RSI,in_RDX);
    *in_RDX = sVar2;
    lVar4 = (*(code *)(in_RDI->resampling_in_buffer).length_)
                      ((in_RDI->resampling_in_buffer).capacity_,
                       (in_RDI->resampling_out_buffer).data_,pfVar3,0,uVar1);
    local_8 = *in_RDX * (lVar4 / (long)(ulong)uVar1);
  }
  return local_8;
}

Assistant:

long
cubeb_resampler_speex<T, InputProcessor, OutputProcessor>::fill_internal_input(
    T * input_buffer, long * input_frames_count, T * output_buffer,
    long /*output_frames_needed*/)
{
  assert(input_buffer && input_frames_count && *input_frames_count &&
         !output_buffer);

  /* The input data, after eventual resampling. This is passed to the callback.
   */
  T * resampled_input = nullptr;
  uint32_t resampled_frame_count =
      input_processor->output_for_input(*input_frames_count);

  /* process the input, and present exactly `output_frames_needed` in the
   * callback. */
  input_processor->input(input_buffer, *input_frames_count);

  /* resampled_frame_count == 0 happens if the resampler
   * doesn't have enough input frames buffered to produce 1 resampled frame. */
  if (resampled_frame_count == 0) {
    return *input_frames_count;
  }

  size_t frames_resampled = 0;
  resampled_input =
      input_processor->output(resampled_frame_count, &frames_resampled);
  *input_frames_count = frames_resampled;

  long got = data_callback(stream, user_ptr, resampled_input, nullptr,
                           resampled_frame_count);

  /* Return the number of initial input frames or part of it.
   * Since output_frames_needed == 0 in input scenario, the only
   * available number outside resampler is the initial number of frames. */
  return (*input_frames_count) * (got / resampled_frame_count);
}